

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

void __thiscall s2polyline_alignment::Window::Window(Window *this,WarpPath *warp_path)

{
  value_type vVar1;
  value_type vVar2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  bool bVar3;
  const_reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  S2LogMessage local_110;
  S2LogMessageVoidify local_fd;
  int local_fc;
  int iStack_f8;
  byte local_f1;
  S2LogMessage local_f0;
  S2LogMessageVoidify local_d9;
  int local_d8;
  int iStack_d4;
  reference local_d0;
  pair<int,_int> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  WarpPath *__range1;
  int local_a8;
  int stride_stop;
  int stride_start;
  int curr_row;
  int prev_row;
  S2LogMessageVoidify local_82;
  byte local_81;
  S2LogMessage local_80;
  S2LogMessageVoidify local_6a;
  byte local_69;
  S2LogMessage local_68;
  S2LogMessageVoidify local_51;
  int local_50 [2];
  pair<int,_int> local_48;
  byte local_3d;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_18;
  WarpPath *warp_path_local;
  Window *this_local;
  
  local_18 = warp_path;
  warp_path_local = (WarpPath *)this;
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  vector(&this->strides_);
  bVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::empty(local_18);
  local_3d = 0;
  if (bVar3) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x2b,kFatal,(ostream *)&std::cerr);
    local_3d = 1;
    poVar6 = S2LogMessage::stream(&local_30);
    poVar6 = std::operator<<(poVar6,"Check failed: !warp_path.empty() ");
    poVar6 = std::operator<<(poVar6,"Cannot construct window from empty warp path.");
    S2LogMessageVoidify::operator&(&local_19,poVar6);
  }
  if ((local_3d & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::front(local_18);
  local_50[1] = 0;
  local_50[0] = 0;
  local_69 = 0;
  local_48 = std::make_pair<int,int>(local_50 + 1,local_50);
  bVar3 = std::operator==(pvVar4,&local_48);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x2c,kFatal,(ostream *)&std::cerr);
    local_69 = 1;
    poVar6 = S2LogMessage::stream(&local_68);
    poVar6 = std::operator<<(poVar6,"Check failed: warp_path.front() == std::make_pair(0, 0) ");
    poVar6 = std::operator<<(poVar6,"Must start at (0, 0).");
    S2LogMessageVoidify::operator&(&local_51,poVar6);
  }
  if ((local_69 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back(local_18);
  this->rows_ = pvVar4->first + 1;
  local_81 = 0;
  if (this->rows_ < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x2e,kFatal,(ostream *)&std::cerr);
    local_81 = 1;
    poVar6 = S2LogMessage::stream(&local_80);
    poVar6 = std::operator<<(poVar6,"Check failed: rows_ > 0 ");
    poVar6 = std::operator<<(poVar6,"Must have at least one row.");
    S2LogMessageVoidify::operator&(&local_6a,poVar6);
  }
  if ((local_81 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
  }
  pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back(local_18);
  this->cols_ = pvVar4->second + 1;
  if (this->cols_ < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&prev_row,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x30,kFatal,(ostream *)&std::cerr);
    poVar6 = S2LogMessage::stream((S2LogMessage *)&prev_row);
    poVar6 = std::operator<<(poVar6,"Check failed: cols_ > 0 ");
    poVar6 = std::operator<<(poVar6,"Must have at least one column.");
    S2LogMessageVoidify::operator&(&local_82,poVar6);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&prev_row);
  }
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  resize(&this->strides_,(long)this->rows_);
  this_00 = local_18;
  stride_start = 0;
  stride_stop = 0;
  local_a8 = 0;
  __range1._4_4_ = 0;
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(local_18);
  pair = (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)&pair), bVar3) {
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end1);
    stride_stop = local_d0->first;
    if (stride_start < stride_stop) {
      local_d8 = local_a8;
      iStack_d4 = __range1._4_4_;
      pvVar5 = std::
               vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ::operator[](&this->strides_,(long)stride_start);
      vVar2.end = iStack_d4;
      vVar2.start = local_d8;
      *pvVar5 = vVar2;
      local_a8 = local_d0->second;
      stride_start = stride_stop;
    }
    __range1._4_4_ = local_d0->second + 1;
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  local_f1 = 0;
  if (stride_stop != this->rows_ + -1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x40,kFatal,(ostream *)&std::cerr);
    local_f1 = 1;
    poVar6 = S2LogMessage::stream(&local_f0);
    poVar6 = std::operator<<(poVar6,"Check failed: (curr_row) == (rows_ - 1) ");
    S2LogMessageVoidify::operator&(&local_d9,poVar6);
  }
  if ((local_f1 & 1) == 0) {
    local_fc = local_a8;
    iStack_f8 = __range1._4_4_;
    pvVar5 = std::
             vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
             ::operator[](&this->strides_,(long)(this->rows_ + -1));
    vVar1.end = iStack_f8;
    vVar1.start = local_fc;
    *pvVar5 = vVar1;
    bVar3 = IsValid(this);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
                 ,0x42,kFatal,(ostream *)&std::cerr);
      poVar6 = S2LogMessage::stream(&local_110);
      poVar6 = std::operator<<(poVar6,"Check failed: this->IsValid() ");
      poVar6 = std::operator<<(poVar6,"Constructor validity check fail.");
      S2LogMessageVoidify::operator&(&local_fd,poVar6);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_110);
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_f0);
}

Assistant:

Window::Window(const WarpPath& warp_path) {
  S2_DCHECK(!warp_path.empty()) << "Cannot construct window from empty warp path.";
  S2_DCHECK(warp_path.front() == std::make_pair(0, 0)) << "Must start at (0, 0).";
  rows_ = warp_path.back().first + 1;
  S2_DCHECK(rows_ > 0) << "Must have at least one row.";
  cols_ = warp_path.back().second + 1;
  S2_DCHECK(cols_ > 0) << "Must have at least one column.";
  strides_.resize(rows_);

  int prev_row = 0;
  int curr_row = 0;
  int stride_start = 0;
  int stride_stop = 0;
  for (const auto& pair : warp_path) {
    curr_row = pair.first;
    if (curr_row > prev_row) {
      strides_[prev_row] = {stride_start, stride_stop};
      stride_start = pair.second;
      prev_row = curr_row;
    }
    stride_stop = pair.second + 1;
  }
  S2_DCHECK_EQ(curr_row, rows_ - 1);
  strides_[rows_ - 1] = {stride_start, stride_stop};
  S2_DCHECK(this->IsValid()) << "Constructor validity check fail.";
}